

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O2

int __thiscall
boost::unit_test::decorator::precondition::clone
          (precondition *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  precondition *this_00;
  predicate_t local_40;
  
  this_00 = (precondition *)operator_new(0x28);
  function1<boost::test_tools::assertion_result,_unsigned_long>::function1
            (&local_40.super_function1<boost::test_tools::assertion_result,_unsigned_long>,
             (function1<boost::test_tools::assertion_result,_unsigned_long> *)(__fn + 8));
  precondition(this_00,&local_40);
  shared_ptr<boost::unit_test::decorator::base>::
  shared_ptr<boost::unit_test::decorator::precondition>
            ((shared_ptr<boost::unit_test::decorator::base> *)this,this_00);
  function1<boost::test_tools::assertion_result,_unsigned_long>::~function1
            (&local_40.super_function1<boost::test_tools::assertion_result,_unsigned_long>);
  return (int)this;
}

Assistant:

virtual base_ptr        clone() const { return base_ptr(new precondition( m_precondition )); }